

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

Expression * __thiscall
CFG::Branch::Render(Branch *this,RelooperBuilder *Builder,Block *Target,bool SetLabel)

{
  Block *this_00;
  LocalSet *item;
  Break *item_00;
  MixedArena *this_01;
  
  this_01 = &((Builder->super_Builder).wasm)->allocator;
  this_00 = (Block *)MixedArena::allocSpace(this_01,0x40,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (this_00->name).super_IString.str._M_len = 0;
  (this_00->name).super_IString.str._M_str = (char *)0x0;
  (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->list).allocator = this_01;
  if (this->Code != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               this->Code);
  }
  if (SetLabel) {
    item = RelooperBuilder::makeSetLabel(Builder,Target->Id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
  }
  if (this->Type == Continue) {
    if (this->Ancestor == (Shape *)0x0) {
      __assert_fail("Ancestor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                    ,0x84,"wasm::Expression *CFG::Branch::Render(RelooperBuilder &, Block *, bool)")
      ;
    }
    item_00 = RelooperBuilder::makeShapeContinue(Builder,this->Ancestor->Id);
  }
  else {
    if (this->Type != Break) goto LAB_00ac18f5;
    item_00 = RelooperBuilder::makeBlockBreak(Builder,Target->Id);
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(this_00->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_00);
LAB_00ac18f5:
  ::wasm::Block::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

wasm::Expression*
Branch::Render(RelooperBuilder& Builder, Block* Target, bool SetLabel) {
  auto* Ret = Builder.makeBlock();
  if (Code) {
    Ret->list.push_back(Code);
  }
  if (SetLabel) {
    Ret->list.push_back(Builder.makeSetLabel(Target->Id));
  }
  if (Type == Break) {
    Ret->list.push_back(Builder.makeBlockBreak(Target->Id));
  } else if (Type == Continue) {
    assert(Ancestor);
    Ret->list.push_back(Builder.makeShapeContinue(Ancestor->Id));
  }
  Ret->finalize();
  return Ret;
}